

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QString * __thiscall QCss::Value::toString(QString *__return_storage_ptr__,Value *this)

{
  byte bVar1;
  int iVar2;
  qsizetype qVar3;
  QLatin1StringView latin1;
  
  if (this->type == KnownIdentifier) {
    iVar2 = ::QVariant::toInt((bool *)&this->variant);
    bVar1 = ""[iVar2];
    qVar3 = QtPrivate::lengthHelperPointer<char>(::values[bVar1].name);
    latin1.m_data = ::values[bVar1].name;
    latin1.m_size = qVar3;
    QString::QString(__return_storage_ptr__,latin1);
  }
  else {
    ::QVariant::toString();
  }
  return __return_storage_ptr__;
}

Assistant:

QString Value::toString() const
{
    if (type == KnownIdentifier) {
        return QLatin1StringView(values[indexOfId[variant.toInt()]].name);
    } else {
        return variant.toString();
    }
}